

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O0

void Cnf_SpecialDataLift(Cnf_Dat_t *p,int nVarsPlus,int firstPiVar,int lastPiVar)

{
  int iVar1;
  int local_20;
  int var;
  int v;
  int lastPiVar_local;
  int firstPiVar_local;
  int nVarsPlus_local;
  Cnf_Dat_t *p_local;
  
  for (local_20 = 0; local_20 < p->nLiterals; local_20 = local_20 + 1) {
    iVar1 = (*p->pClauses)[local_20] / 2;
    if ((iVar1 < firstPiVar) || (lastPiVar <= iVar1)) {
      (*p->pClauses)[local_20] = nVarsPlus * 2 + (*p->pClauses)[local_20];
    }
    else {
      (*p->pClauses)[local_20] = (*p->pClauses)[local_20] + firstPiVar * -2;
    }
  }
  return;
}

Assistant:

void Cnf_SpecialDataLift( Cnf_Dat_t * p, int nVarsPlus, int firstPiVar, int lastPiVar)
{
    int v, var;
    for ( v = 0; v < p->nLiterals; v++ )
    {
        var = p->pClauses[0][v] / 2;
        if (var < firstPiVar || var >= lastPiVar)
            p->pClauses[0][v] += 2*nVarsPlus;
        else 
            p->pClauses[0][v] -= 2*firstPiVar;
    }
}